

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes_ReadLittleEndian64_Test::
~Fixed64CasesWithSizes_ReadLittleEndian64_Test(Fixed64CasesWithSizes_ReadLittleEndian64_Test *this)

{
  io::anon_unknown_0::Fixed64CasesWithSizes_ReadLittleEndian64_Test::
  ~Fixed64CasesWithSizes_ReadLittleEndian64_Test
            ((Fixed64CasesWithSizes_ReadLittleEndian64_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(Fixed64CasesWithSizes, ReadLittleEndian64) {
  Fixed64Case kFixed64Cases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kFixed64Cases_case.bytes, sizeof(kFixed64Cases_case.bytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint64_t value;
    EXPECT_TRUE(coded_input.ReadLittleEndian64(&value));
    EXPECT_EQ(kFixed64Cases_case.value, value);
  }

  EXPECT_EQ(sizeof(uint64_t), input.ByteCount());
}